

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O2

void slider_orientation(t_slider *x,t_floatarg forient)

{
  short *psVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  t_iem_orientation tVar4;
  ushort uVar5;
  
  tVar4 = (t_iem_orientation)((int)forient != 0);
  if (x->x_orientation != tVar4) {
    uVar2 = (x->x_gui).x_h;
    uVar3 = (x->x_gui).x_w;
    (x->x_gui).x_h = uVar3;
    (x->x_gui).x_w = uVar2;
    uVar5 = -(ushort)((int)forient != 0) | 1;
    psVar1 = &(x->x_gui).x_obj.te_xpix;
    *psVar1 = *psVar1 + uVar5 * 3;
    psVar1 = &(x->x_gui).x_obj.te_ypix;
    *psVar1 = *psVar1 + uVar5 * -2;
  }
  x->x_orientation = tVar4;
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void slider_orientation(t_slider *x, t_floatarg forient)
{
    int orient = !!(int)forient;
    if(orient != x->x_orientation)
    {
        int w = x->x_gui.x_w;
        x->x_gui.x_w = x->x_gui.x_h;
        x->x_gui.x_h = w;

            /* urgh. for historical reasons,
             * sliders have a different offset depending on their orientation.
             * for backwards-compatibility, an ideal solution would handle
             * these offsets during load/save,
             * but we cannot access the object position in the constructor,
             * so we need to do it here...
             */
        x->x_gui.x_obj.te_xpix += LMARGIN * ((horizontal==orient)?1:-1);
        x->x_gui.x_obj.te_ypix -= TMARGIN * ((horizontal==orient)?1:-1);
    }
    x->x_orientation = orient;

    iemgui_size(x, &x->x_gui);
}